

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O2

bool __thiscall booster::aio::base_fast_reactor::check(base_fast_reactor *this,int fd,int *error)

{
  value_type_conflict1 local_c;
  
  if (fd < 0) {
    *error = 0x16;
  }
  else if ((int)((ulong)((long)(this->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2) <= fd) {
    local_c = 0;
    std::vector<int,_std::allocator<int>_>::resize(&this->events_,(ulong)(fd + 1),&local_c);
  }
  return -1 < fd;
}

Assistant:

bool check(int fd,int &error)
		{
			if(fd < 0) {
				error=EINVAL;
				return false;
			}
			if(fd >= int(events_.size())) {
				events_.resize(fd+1,0);
			}
			return true;
		}